

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

wchar_t rd_options(void)

{
  uint8_t b;
  uint8_t value;
  char name [40];
  byte local_3a;
  uint8_t local_39;
  char local_38 [40];
  
  rd_byte(&local_3a);
  (player->opts).delay_factor = local_3a;
  rd_byte(&local_3a);
  (player->opts).hitpoint_warn = local_3a;
  rd_byte(&local_3a);
  (player->opts).lazymove_delay = local_3a;
  if (angband_term[0] == (term *)0x0) {
    strip_bytes(1);
  }
  else {
    rd_byte(&local_3a);
    if (2 < local_3a) {
      local_3a = 0;
    }
    angband_term[0]->sidebar_mode = (uint)local_3a;
  }
  rd_string(local_38,0x28);
  if (local_38[0] != '\0') {
    do {
      rd_byte(&local_39);
      option_set(local_38,(uint)(local_39 != '\0'));
      rd_string(local_38,0x28);
    } while (local_38[0] != '\0');
  }
  return L'\0';
}

Assistant:

int rd_options(void)
{
	uint8_t b;

	/*** Special info */

	/* Read "delay_factor" */
	rd_byte(&b);
	player->opts.delay_factor = b;

	/* Read "hitpoint_warn" */
	rd_byte(&b);
	player->opts.hitpoint_warn = b;

	/* Read lazy movement delay */
	rd_byte(&b);
	player->opts.lazymove_delay = b;

	/* Read sidebar mode (if it's an actual game) */
	if (angband_term[0]) {
		rd_byte(&b);
		if (b >= SIDEBAR_MAX) b = SIDEBAR_LEFT;
		SIDEBAR_MODE = b;
	} else {
		strip_bytes(1);
	}


	/* Read options */
	while (1) {
		uint8_t value;
		char name[40];
		rd_string(name, sizeof name);

		if (!name[0])
			break;

		rd_byte(&value);
		option_set(name, !!value);
	}

	return 0;
}